

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginTooltip(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImVec2 IVar3;
  ImVec2 tooltip_pos;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 in_stack_fffffffffffffff0;
  
  pIVar2 = GImGui;
  if ((GImGui->DragDropWithinSourceOrTarget & 1U) == 0) {
    BeginTooltipEx((ImGuiWindowFlags)in_stack_fffffffffffffff0.y,in_stack_fffffffffffffff0.x._3_1_);
  }
  else {
    fVar1 = (GImGui->Style).MouseCursorScale;
    ImVec2::ImVec2(&local_18,fVar1 * 16.0,fVar1 * 8.0);
    IVar3 = operator+(in_stack_ffffffffffffffc8,(ImVec2 *)0x1495b7);
    ImVec2::ImVec2(&local_20,0.0,0.0);
    SetNextWindowPos((ImVec2 *)&stack0xfffffffffffffff0,0,&local_20);
    SetNextWindowBgAlpha((pIVar2->Style).Colors[4].w * 0.6);
    BeginTooltipEx((ImGuiWindowFlags)IVar3.y,IVar3.x._3_1_);
  }
  return;
}

Assistant:

void ImGui::BeginTooltip()
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        BeginTooltipEx(0, true);
    }
    else
    {
        BeginTooltipEx(0, false);
    }
}